

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall
Scene::render_pass(Scene *this,RenderPass pass,Shadow shadow,bool light_projection,int display_w,
                  int display_h,ResourcePack *resource_pack,Camera *camera)

{
  PFNGLUNIFORMMATRIX4FVPROC p_Var1;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar2;
  ostream *this_00;
  size_type sVar3;
  col_type *pcVar4;
  float *pfVar5;
  Mesh *this_01;
  undefined4 in_register_00000084;
  vec<3,_float,_(glm::qualifier)0> *up;
  double dVar6;
  undefined1 local_430 [8];
  mat4 depth_bias_mvp;
  mat4 depth_mvp;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  double local_388;
  double local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  undefined1 local_330 [8];
  mat4 bias;
  mat<4,_4,_float,_(glm::qualifier)0> local_2b0;
  undefined1 local_270 [8];
  mat4 lightProjection;
  vec<3,_float,_(glm::qualifier)0> local_224;
  vec<3,_float,_(glm::qualifier)0> local_218;
  undefined1 local_20c [8];
  mat4 lightView;
  float far_plane;
  float near_plane;
  mat4 local_184;
  undefined1 local_144 [8];
  mat4 mvp;
  GLuint program_id;
  GLuint uniform;
  string depthmap_shader;
  undefined1 local_d0 [8];
  string box_mesh;
  undefined1 local_a8 [8];
  string blue_shader;
  undefined1 local_80 [8];
  string shadowpcf_shader;
  allocator local_49;
  undefined1 local_48 [8];
  string shadow_shader;
  int display_h_local;
  int display_w_local;
  bool light_projection_local;
  Shadow shadow_local;
  RenderPass pass_local;
  Scene *this_local;
  
  up = (vec<3,_float,_(glm::qualifier)0> *)CONCAT44(in_register_00000084,display_w);
  shadow_shader.field_2._12_4_ = display_h;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,"shadow",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_80,"shadowpcf",(allocator *)(blue_shader.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(blue_shader.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_a8,"blue",(allocator *)(box_mesh.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(box_mesh.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d0,"box",(allocator *)(depthmap_shader.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(depthmap_shader.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&uniform,"depthmap",(allocator *)((long)&program_id + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&program_id + 3));
  mvp.value[3].field_3.w = -NAN;
  mvp.value[3].field_2.z = -NAN;
  if (pass == GenerateDepthMap) {
    glViewport(0,0,this->shadow_width,this->shadow_height);
    (*__glewBindFramebuffer)(0x8d40,this->depth_map_framebuffer);
    glClear(0x100);
    glCullFace(0x404);
  }
  else if (pass == Display) {
    glViewport(0,0,display_w,shadow_shader.field_2._12_4_);
    glClear(0x4100);
  }
  Camera::get_projection
            (&local_184,camera,(float)display_w / (float)(int)shadow_shader.field_2._12_4_);
  Camera::get_view((mat4 *)&far_plane,camera);
  glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_144,&local_184,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)&far_plane);
  lightView.value[3].field_3.w = -10.0;
  lightView.value[3].field_2.z = 20.0;
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_218,-2.0,4.0,-1.0);
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_224,0.0,0.0,0.0);
  glm::vec<3,_float,_(glm::qualifier)0>::vec
            ((vec<3,_float,_(glm::qualifier)0> *)&lightProjection.value[3].field_2,0.0,1.0,0.0);
  glm::lookAt<float,(glm::qualifier)0>
            ((mat<4,_4,_float,_(glm::qualifier)0> *)local_20c,(glm *)&local_218,&local_224,
             (vec<3,_float,_(glm::qualifier)0> *)&lightProjection.value[3].field_2,up);
  if (light_projection) {
    glm::ortho<float>(&local_2b0,-20.0,20.0,-20.0,20.0,lightView.value[3].field_3.w,
                      lightView.value[3].field_2.z);
    memcpy(local_270,&local_2b0,0x40);
  }
  else {
    dVar6 = glm::radians<double>(0.45);
    glm::perspective<float>
              ((mat<4,_4,_float,_(glm::qualifier)0> *)&bias.value[3].field_2,(float)dVar6,
               (float)display_w / (float)(int)shadow_shader.field_2._12_4_,
               lightView.value[3].field_3.w,lightView.value[3].field_2.z);
    memcpy(local_270,&bias.value[3].field_2,0x40);
  }
  local_338 = 0.5;
  local_340 = 0.0;
  local_348 = 0.0;
  local_350 = 0.0;
  local_358 = 0.0;
  local_360 = 0.5;
  local_368 = 0.0;
  local_370 = 0.0;
  local_378 = 0.0;
  local_380 = 0.0;
  local_388 = 0.5;
  local_390 = 0.0;
  local_398 = 0.5;
  local_3a0 = 0.5;
  local_3a8 = 0.5;
  depth_mvp.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  depth_mvp.value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3ff00000;
  glm::mat<4,4,float,(glm::qualifier)0>::
  mat<double,double,double,double,double,double,double,double,double,double,double,double,double,double,double,double>
            ((mat<4,4,float,(glm::qualifier)0> *)local_330,&local_338,&local_340,&local_348,
             &local_350,&local_358,&local_360,&local_368,&local_370,&local_378,&local_380,&local_388
             ,&local_390,&local_398,&local_3a0,&local_3a8,(double *)&depth_mvp.value[3].field_2.z);
  glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&depth_bias_mvp.value[3].field_2,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)local_270,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)local_20c);
  glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_430,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)local_330,
                 (mat<4,_4,_float,_(glm::qualifier)0> *)&depth_bias_mvp.value[3].field_2);
  (*__glewEnableVertexAttribArray)(0);
  (*__glewBindBuffer)(0x8892,this->grid_vertex_buffer);
  (*__glewVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  if (pass == Display) {
    glBindTexture(0xde1,this->depth_map);
  }
  if (pass == GenerateDepthMap) {
    mvp.value[3].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         ResourcePack::get_program(resource_pack,(string *)&uniform);
    (*__glewUseProgram)((GLuint)mvp.value[3].field_2);
    aVar2.w = (float)(*__glewGetUniformLocation)(mvp.value[3].field_2.z,"depth_mvp");
    p_Var1 = __glewUniformMatrix4fv;
    mvp.value[3].field_3 = aVar2;
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)&depth_bias_mvp.value[3].field_2,0);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,0);
    (*p_Var1)((GLint)aVar2,1,'\0',pfVar5);
  }
  else if (pass == Display) {
    if (shadow == ShadowMapping) {
      mvp.value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           ResourcePack::get_program(resource_pack,(string *)local_48);
    }
    else {
      if (shadow != ShadowMappingPCF) {
        this_00 = std::operator<<((ostream *)&std::cout,"UNIMPLEMENTED");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      mvp.value[3].field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           ResourcePack::get_program(resource_pack,(string *)local_80);
    }
    (*__glewUseProgram)((GLuint)mvp.value[3].field_2);
    aVar2.w = (float)(*__glewGetUniformLocation)(mvp.value[3].field_2.z,"mvp");
    p_Var1 = __glewUniformMatrix4fv;
    mvp.value[3].field_3 = aVar2;
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)local_144,0);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,0);
    (*p_Var1)((GLint)aVar2,1,'\0',pfVar5);
    aVar2.w = (float)(*__glewGetUniformLocation)(mvp.value[3].field_2.z,"depth_bias_mvp");
    p_Var1 = __glewUniformMatrix4fv;
    mvp.value[3].field_3 = aVar2;
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)local_430,0);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,0);
    (*p_Var1)((GLint)aVar2,1,'\0',pfVar5);
  }
  (*__glewBindBuffer)(0x8893,this->grid_index_buffer);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->grid_indices);
  glDrawElements(4,sVar3 & 0xffffffff,0x1405,0);
  (*__glewDisableVertexAttribArray)(0);
  (*__glewEnableVertexAttribArray)(0);
  (*__glewBindBuffer)(0x8892,this->object_vertex_buffer);
  (*__glewVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  if (pass == Display) {
    (*__glewEnableVertexAttribArray)(1);
    (*__glewBindBuffer)(0x8892,this->object_normal_buffer);
    (*__glewVertexAttribPointer)(1,3,0x1406,'\0',0,(void *)0x0);
    glBindTexture(0xde1,this->depth_map);
  }
  if (pass == GenerateDepthMap) {
    mvp.value[3].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         ResourcePack::get_program(resource_pack,(string *)&uniform);
    (*__glewUseProgram)((GLuint)mvp.value[3].field_2);
    aVar2.w = (float)(*__glewGetUniformLocation)(mvp.value[3].field_2.z,"depth_mvp");
    p_Var1 = __glewUniformMatrix4fv;
    mvp.value[3].field_3 = aVar2;
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)&depth_bias_mvp.value[3].field_2,0);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,0);
    (*p_Var1)((GLint)aVar2,1,'\0',pfVar5);
  }
  else if (pass == Display) {
    mvp.value[3].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
         ResourcePack::get_program(resource_pack,(string *)local_a8);
    (*__glewUseProgram)((GLuint)mvp.value[3].field_2);
    aVar2.w = (float)(*__glewGetUniformLocation)(mvp.value[3].field_2.z,"mvp");
    p_Var1 = __glewUniformMatrix4fv;
    mvp.value[3].field_3 = aVar2;
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)local_144,0);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,0);
    (*p_Var1)((GLint)aVar2,1,'\0',pfVar5);
    aVar2.w = (float)(*__glewGetUniformLocation)(mvp.value[3].field_2.z,"depth_bias_mvp");
    p_Var1 = __glewUniformMatrix4fv;
    mvp.value[3].field_3 = aVar2;
    pcVar4 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[]
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)local_430,0);
    pfVar5 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](pcVar4,0);
    (*p_Var1)((GLint)aVar2,1,'\0',pfVar5);
  }
  this_01 = ResourcePack::get_mesh(resource_pack,(string *)local_d0);
  sVar3 = std::vector<float,_std::allocator<float>_>::size(&this_01->vertices);
  glDrawArrays(4,0,sVar3 & 0xffffffff);
  (*__glewDisableVertexAttribArray)(0);
  if (pass == Display) {
    (*__glewDisableVertexAttribArray)(1);
  }
  if (pass == GenerateDepthMap) {
    (*__glewBindFramebuffer)(0x8d40,0);
    glCullFace(0x405);
  }
  std::__cxx11::string::~string((string *)&uniform);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Scene::render_pass(RenderPass pass, Shadow shadow, bool light_projection, int display_w, int display_h, ResourcePack& resource_pack, Camera& camera) {
    std::string shadow_shader("shadow");
    std::string shadowpcf_shader("shadowpcf");
    std::string blue_shader("blue");
    std::string box_mesh("box");
    std::string depthmap_shader("depthmap");
    GLuint uniform = -1;
    GLuint program_id = -1;

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            glViewport(0, 0, shadow_width, shadow_height);
            glBindFramebuffer(GL_FRAMEBUFFER, depth_map_framebuffer);
            glClear(GL_DEPTH_BUFFER_BIT);
            glCullFace(GL_FRONT);
            break;
        case RenderPass::Display:
            glViewport(0, 0, display_w, display_h);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            break;
    }

    glm::mat4 mvp = camera.get_projection(static_cast<float>(display_w)/display_h) * camera.get_view();
    float near_plane = -10.0f, far_plane = 20.0f;
    glm::mat4 lightView = glm::lookAt(
        glm::vec3(-2.0f, 4.0f, -1.0f),
        glm::vec3(0.0f, 0.0f,  0.0f),
        glm::vec3(0.0f, 1.0f,  0.0f)
    );
    glm::mat4 lightProjection;
    if (light_projection) {
        lightProjection = glm::ortho(-20.0f, 20.0f, -20.0f, 20.0f, near_plane, far_plane);
    }
    else {
        lightProjection = glm::perspective(
            (float)glm::radians(0.45),
            static_cast<float>(display_w)/display_h,
            near_plane,
            far_plane
        );
    }
    glm::mat4 bias(
        0.5, 0.0, 0.0, 0.0,
        0.0, 0.5, 0.0, 0.0,
        0.0, 0.0, 0.5, 0.0,
        0.5, 0.5, 0.5, 1.0
    );
    glm::mat4 depth_mvp = lightProjection * lightView;
    glm::mat4 depth_bias_mvp = bias * depth_mvp;

    // Draw ground
    glEnableVertexAttribArray(0);
    glBindBuffer(GL_ARRAY_BUFFER, grid_vertex_buffer);
    glVertexAttribPointer(
        0,
        3,
        GL_FLOAT,
        GL_FALSE,
        0,
        (void*)0
    );

    if (pass == RenderPass::Display) {
        glBindTexture(GL_TEXTURE_2D, depth_map);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            program_id = resource_pack.get_program(depthmap_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "depth_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_mvp[0][0]);
            break;
        case RenderPass::Display:
            switch (shadow) {
                case Shadow::ShadowMapping:
                    program_id = resource_pack.get_program(shadow_shader);
                    break;
                case Shadow::ShadowMappingPCF:
                    program_id = resource_pack.get_program(shadowpcf_shader);
                    break;
                default:
                    std::cout << "UNIMPLEMENTED" << std::endl;
                    exit(1);
            }
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &mvp[0][0]);
            uniform = glGetUniformLocation(program_id, "depth_bias_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_bias_mvp[0][0]);
            break;
    }

    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, grid_index_buffer);
    glDrawElements(GL_TRIANGLES, grid_indices.size(), GL_UNSIGNED_INT, 0);

    glDisableVertexAttribArray(0);

    // Draw object
    glEnableVertexAttribArray(0);
    glBindBuffer(GL_ARRAY_BUFFER, object_vertex_buffer);
    glVertexAttribPointer(
        0,
        3,
        GL_FLOAT,
        GL_FALSE,
        0,
        (void*)0
    );

    if (pass == RenderPass::Display) {
        glEnableVertexAttribArray(1);
        glBindBuffer(GL_ARRAY_BUFFER, object_normal_buffer);
        glVertexAttribPointer(
            1,
            3,
            GL_FLOAT,
            GL_FALSE,
            0,
            (void*)0
        );
    }

    if (pass == RenderPass::Display) {
        glBindTexture(GL_TEXTURE_2D, depth_map);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            program_id = resource_pack.get_program(depthmap_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "depth_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_mvp[0][0]);
            break;
        case RenderPass::Display:
            program_id = resource_pack.get_program(blue_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &mvp[0][0]);
            uniform = glGetUniformLocation(program_id, "depth_bias_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_bias_mvp[0][0]);
            break;
    }

    glDrawArrays(GL_TRIANGLES, 0, resource_pack.get_mesh(box_mesh)->vertices.size());

    glDisableVertexAttribArray(0);

    if (pass == RenderPass::Display) {
        glDisableVertexAttribArray(1);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glCullFace(GL_BACK);
            break;
        case RenderPass::Display:
            break;
    }
}